

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusinputcontextproxy.h
# Opt level: O3

QDBusPendingReply<> * __thiscall
QIBusInputContextProxy::SetCursorLocationRelative
          (QDBusPendingReply<> *__return_storage_ptr__,QIBusInputContextProxy *this,int x,int y,
          int w,int h)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QVariant> local_e8;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  QVariant local_b8;
  QVariant local_98;
  QVariant local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8.size = 0;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (QVariant *)0x0;
  local_c8 = h;
  local_c4 = w;
  local_c0 = y;
  local_bc = x;
  QVariant::QVariant((QVariant *)local_58,
                     (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType,
                     &local_bc);
  QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
            ((QMovableArrayOps<QVariant> *)&local_e8,0,(QVariant *)local_58);
  QList<QVariant>::end((QList<QVariant> *)&local_e8);
  QVariant::QVariant(&local_78,
                     (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType,
                     &local_c0);
  QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
            ((QMovableArrayOps<QVariant> *)&local_e8,local_e8.size,&local_78);
  QList<QVariant>::end((QList<QVariant> *)&local_e8);
  QVariant::QVariant(&local_98,
                     (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType,
                     &local_c4);
  QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
            ((QMovableArrayOps<QVariant> *)&local_e8,local_e8.size,&local_98);
  QList<QVariant>::end((QList<QVariant> *)&local_e8);
  QVariant::QVariant(&local_b8,
                     (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType,
                     &local_c8);
  QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
            ((QMovableArrayOps<QVariant> *)&local_e8,local_e8.size,&local_b8);
  QList<QVariant>::end((QList<QVariant> *)&local_e8);
  QVariant::~QVariant(&local_b8);
  QVariant::~QVariant(&local_98);
  QVariant::~QVariant(&local_78);
  QVariant::~QVariant((QVariant *)local_58);
  local_58._0_8_ = (QArrayData *)0x0;
  local_58._8_8_ = L"SetCursorLocationRelative";
  local_58._16_8_ = 0x19;
  QDBusAbstractInterface::asyncCallWithArgumentList((QString *)&local_78,(QList *)this);
  QDBusPendingReplyBase::QDBusPendingReplyBase(&__return_storage_ptr__->super_QDBusPendingReplyBase)
  ;
  QDBusPendingReplyBase::assign((QDBusPendingCall *)__return_storage_ptr__);
  if (__return_storage_ptr__->super_QDBusPendingReplyBase != (QDBusPendingReplyBase)0x0) {
    QDBusPendingReplyBase::setMetaTypes((int)__return_storage_ptr__,(QMetaType *)0x0);
  }
  QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)&local_78);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusPendingReply<> SetCursorLocationRelative(int x, int y, int w, int h)
    {
        QList<QVariant> argumentList;
        argumentList << QVariant::fromValue(x) << QVariant::fromValue(y) << QVariant::fromValue(w) << QVariant::fromValue(h);
        return asyncCallWithArgumentList(QStringLiteral("SetCursorLocationRelative"), argumentList);
    }